

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeBlocks.cpp
# Opt level: O0

Block * __thiscall
wasm::MergeBlocks::optimize
          (MergeBlocks *this,Expression *curr,Expression **child,Block *outer,
          Expression **dependency1,Expression **dependency2)

{
  Expression *this_00;
  MergeBlocks *pMVar1;
  bool bVar2;
  PassOptions *pPVar3;
  Module *pMVar4;
  size_t sVar5;
  Expression **ppEVar6;
  optional<wasm::Type> type_;
  bool local_4d3;
  bool local_4b9;
  uint local_4ac;
  undefined1 auStack_4a8 [4];
  Index i;
  undefined1 local_4a0;
  BasicType local_494;
  Expression *local_490;
  Expression *back;
  Block *block;
  EffectAnalyzer local_478;
  int local_314;
  byte local_30d;
  EffectAnalyzer local_300;
  undefined1 local_1a0 [8];
  EffectAnalyzer childEffects;
  Expression **dependency2_local;
  Expression **dependency1_local;
  Block *outer_local;
  Expression **child_local;
  Expression *curr_local;
  MergeBlocks *this_local;
  
  pMVar1 = (MergeBlocks *)outer;
  if (*child != (Expression *)0x0) {
    childEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)dependency2;
    if (((dependency1 != (Expression **)0x0) && (*dependency1 != (Expression *)0x0)) ||
       ((dependency2 != (Expression **)0x0 && (*dependency2 != (Expression *)0x0)))) {
      pPVar3 = Pass::getPassOptions((Pass *)this);
      pMVar4 = Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>::
               getModule(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                          ).
                          super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                          .
                          super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                        );
      EffectAnalyzer::EffectAnalyzer((EffectAnalyzer *)local_1a0,pPVar3,pMVar4,*child);
      local_30d = 0;
      local_4b9 = false;
      if ((dependency1 != (Expression **)0x0) &&
         (local_4b9 = false, *dependency1 != (Expression *)0x0)) {
        pPVar3 = Pass::getPassOptions((Pass *)this);
        pMVar4 = Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                 ::getModule(&(this->
                              super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                              ).
                              super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                              .
                              super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                            );
        EffectAnalyzer::EffectAnalyzer(&local_300,pPVar3,pMVar4,*dependency1);
        local_30d = 1;
        local_4b9 = EffectAnalyzer::invalidates(&local_300,(EffectAnalyzer *)local_1a0);
      }
      if ((local_30d & 1) != 0) {
        EffectAnalyzer::~EffectAnalyzer(&local_300);
      }
      if (local_4b9 == false) {
        block._7_1_ = 0;
        local_4d3 = false;
        if ((childEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
           (local_4d3 = false,
           *(long *)childEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count !=
           0)) {
          pPVar3 = Pass::getPassOptions((Pass *)this);
          pMVar4 = Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                   ::getModule(&(this->
                                super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                                ).
                                super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                                .
                                super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                              );
          EffectAnalyzer::EffectAnalyzer
                    (&local_478,pPVar3,pMVar4,
                     *(Expression **)
                      childEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count)
          ;
          block._7_1_ = 1;
          local_4d3 = EffectAnalyzer::invalidates(&local_478,(EffectAnalyzer *)local_1a0);
        }
        if ((block._7_1_ & 1) != 0) {
          EffectAnalyzer::~EffectAnalyzer(&local_478);
        }
        if (local_4d3 == false) {
          local_314 = 0;
        }
        else {
          local_314 = 1;
          this_local = (MergeBlocks *)outer;
        }
      }
      else {
        local_314 = 1;
        this_local = (MergeBlocks *)outer;
      }
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_1a0);
      if (local_314 != 0) {
        return (Block *)this_local;
      }
    }
    back = (Expression *)Expression::dynCast<wasm::Block>(*child);
    pMVar1 = (MergeBlocks *)outer;
    if ((((Block *)back != (Block *)0x0) &&
        (bVar2 = IString::is(&(((Block *)back)->name).super_IString), pMVar1 = (MergeBlocks *)outer,
        !bVar2)) &&
       (sVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (back + 2)), pMVar1 = (MergeBlocks *)outer, 1 < sVar5)) {
      ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           (back + 2));
      local_490 = *ppEVar6;
      local_494 = unreachable;
      bVar2 = wasm::Type::operator==(&local_490->type,&local_494);
      pMVar1 = (MergeBlocks *)outer;
      if ((!bVar2) &&
         (bVar2 = wasm::Type::operator!=(&back->type,&local_490->type),
         pMVar1 = (MergeBlocks *)outer, !bVar2)) {
        *child = local_490;
        this->refinalize = true;
        if (outer == (Block *)0x0) {
          ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                *)(back + 2));
          this_00 = back;
          *ppEVar6 = curr;
          std::optional<wasm::Type>::optional<wasm::Type_&,_true>
                    ((optional<wasm::Type> *)auStack_4a8,&curr->type);
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._9_7_ = 0;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_payload =
               (_Storage<wasm::Type,_true>)_auStack_4a8;
          type_.super__Optional_base<wasm::Type,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_4a0;
          Block::finalize((Block *)this_00,type_,Unknown);
          Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>::
          replaceCurrent(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>_>
                          ).
                          super_PostWalker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                          .
                          super_Walker<wasm::MergeBlocks,_wasm::UnifiedExpressionVisitor<wasm::MergeBlocks,_void>_>
                         ,back);
          this_local = (MergeBlocks *)back;
          pMVar1 = this_local;
        }
        else {
          ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                              (&(outer->list).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              );
          if (*ppEVar6 != curr) {
            __assert_fail("outer->list.back() == curr",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MergeBlocks.cpp"
                          ,0x22a,
                          "Block *wasm::MergeBlocks::optimize(Expression *, Expression *&, Block *, Expression **, Expression **)"
                         );
          }
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::pop_back
                    (&(outer->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>);
          for (local_4ac = 0;
              sVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  *)(back + 2)), (ulong)local_4ac < sVar5 - 1;
              local_4ac = local_4ac + 1) {
            ppEVar6 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                      operator[]((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                  *)(back + 2),(ulong)local_4ac);
            ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                      (&(outer->list).
                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                       *ppEVar6);
          }
          ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                    (&(outer->list).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
                     curr);
          pMVar1 = (MergeBlocks *)outer;
        }
      }
    }
  }
  this_local = pMVar1;
  return (Block *)this_local;
}

Assistant:

Block* optimize(Expression* curr,
                  Expression*& child,
                  Block* outer = nullptr,
                  Expression** dependency1 = nullptr,
                  Expression** dependency2 = nullptr) {
    if (!child) {
      return outer;
    }
    if ((dependency1 && *dependency1) || (dependency2 && *dependency2)) {
      // there are dependencies, things we must be reordered through. make sure
      // no problems there
      EffectAnalyzer childEffects(getPassOptions(), *getModule(), child);
      if (dependency1 && *dependency1 &&
          EffectAnalyzer(getPassOptions(), *getModule(), *dependency1)
            .invalidates(childEffects)) {
        return outer;
      }
      if (dependency2 && *dependency2 &&
          EffectAnalyzer(getPassOptions(), *getModule(), *dependency2)
            .invalidates(childEffects)) {
        return outer;
      }
    }
    if (auto* block = child->dynCast<Block>()) {
      if (!block->name.is() && block->list.size() >= 2) {
        auto* back = block->list.back();
        if (back->type == Type::unreachable) {
          // curr is not reachable, dce could remove it; don't try anything
          // fancy here
          return outer;
        }
        // We are going to replace the block with the final element, so they
        // should be identically typed. Note that we could check for subtyping
        // here, but it would not help in the general case: we know that this
        // block has no breaks (as confirmed above), and so the local-subtyping
        // pass will turn its type into that of its final element, if the final
        // element has a more specialized type. (If we did want to handle that,
        // we'd need to then run a ReFinalize after everything, which would add
        // more complexity here.)
        if (block->type != back->type) {
          return outer;
        }
        child = back;
        refinalize = true;
        if (outer == nullptr) {
          // reuse the block, move it out
          block->list.back() = curr;
          // we want the block outside to have the same type as curr had
          block->finalize(curr->type);
          replaceCurrent(block);
          return block;
        } else {
          // append to an existing outer block
          assert(outer->list.back() == curr);
          outer->list.pop_back();
          for (Index i = 0; i < block->list.size() - 1; i++) {
            outer->list.push_back(block->list[i]);
          }
          outer->list.push_back(curr);
        }
      }
    }
    return outer;
  }